

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location)

{
  int *piVar1;
  int iVar2;
  void **ppvVar3;
  bool bVar4;
  int iVar5;
  UninterpretedOption_NamePart *pUVar6;
  string *psVar7;
  LocationRecorder location;
  string identifier;
  LocationRecorder local_60;
  string local_50;
  
  iVar5 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
  iVar2 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.allocated_size_;
  if (iVar5 < iVar2) {
    ppvVar3 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.elements_;
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
    pUVar6 = (UninterpretedOption_NamePart *)ppvVar3[iVar5];
  }
  else {
    iVar5 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.total_size_;
    if (iVar2 == iVar5) {
      internal::RepeatedPtrFieldBase::Reserve
                (&(uninterpreted_option->name_).super_RepeatedPtrFieldBase,iVar5 + 1);
    }
    piVar1 = &(uninterpreted_option->name_).super_RepeatedPtrFieldBase.allocated_size_;
    *piVar1 = *piVar1 + 1;
    pUVar6 = internal::GenericTypeHandler<google::protobuf::UninterpretedOption_NamePart>::New();
    ppvVar3 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.elements_;
    iVar5 = (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_;
    (uninterpreted_option->name_).super_RepeatedPtrFieldBase.current_size_ = iVar5 + 1;
    ppvVar3[iVar5] = pUVar6;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  if (iVar5 == 0) {
    bVar4 = Consume(this,"(");
    if (bVar4) {
      LocationRecorder::Init(&local_60,part_location);
      LocationRecorder::AddPath(&local_60,1);
      if ((this->input_->current_).type == TYPE_IDENTIFIER) {
        bVar4 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar4) goto LAB_0021c593;
        *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 1;
        if (pUVar6->name_part_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar7 = (string *)operator_new(0x20);
          (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_local_buf[0] = '\0';
          pUVar6->name_part_ = psVar7;
        }
        std::__cxx11::string::_M_append((char *)pUVar6->name_part_,(ulong)local_50._M_dataplus._M_p)
        ;
      }
      while( true ) {
        iVar5 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar5 != 0) break;
        bVar4 = Consume(this,".");
        if (!bVar4) goto LAB_0021c593;
        *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 1;
        if (pUVar6->name_part_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar7 = (string *)operator_new(0x20);
          (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_local_buf[0] = '\0';
          pUVar6->name_part_ = psVar7;
        }
        std::__cxx11::string::append((char *)pUVar6->name_part_);
        bVar4 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
        if (!bVar4) goto LAB_0021c593;
        *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 1;
        if (pUVar6->name_part_ == (string *)internal::kEmptyString_abi_cxx11_) {
          psVar7 = (string *)operator_new(0x20);
          (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
          psVar7->_M_string_length = 0;
          (psVar7->field_2)._M_local_buf[0] = '\0';
          pUVar6->name_part_ = psVar7;
        }
        std::__cxx11::string::_M_append((char *)pUVar6->name_part_,(ulong)local_50._M_dataplus._M_p)
        ;
      }
      LocationRecorder::~LocationRecorder(&local_60);
      bVar4 = Consume(this,")");
      if (bVar4) {
        *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 2;
        pUVar6->is_extension_ = true;
        goto LAB_0021c417;
      }
    }
  }
  else {
    LocationRecorder::Init(&local_60,part_location);
    LocationRecorder::AddPath(&local_60,1);
    bVar4 = ConsumeIdentifier(this,&local_50,"Expected identifier.");
    if (bVar4) {
      *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 1;
      if (pUVar6->name_part_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        pUVar6->name_part_ = psVar7;
      }
      std::__cxx11::string::_M_append((char *)pUVar6->name_part_,(ulong)local_50._M_dataplus._M_p);
      *(byte *)pUVar6->_has_bits_ = (byte)pUVar6->_has_bits_[0] | 2;
      pUVar6->is_extension_ = false;
      LocationRecorder::~LocationRecorder(&local_60);
      if (bVar4) {
LAB_0021c417:
        bVar4 = true;
        goto LAB_0021c59f;
      }
    }
    else {
LAB_0021c593:
      LocationRecorder::~LocationRecorder(&local_60);
    }
  }
  bVar4 = false;
LAB_0021c59f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {  // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}